

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::InvalidateDependand(CodeGenGenericContext *this,x86Reg dreg)

{
  uint uVar1;
  MemCache *pMVar2;
  MemCache *entry;
  uint i_2;
  uint i_1;
  uint i;
  x86Reg dreg_local;
  CodeGenGenericContext *this_local;
  
  for (i_2 = 0; i_2 < 0x11; i_2 = i_2 + 1) {
    if ((this->genReg[i_2].type == argReg) && (this->genReg[i_2].field_1.reg == dreg)) {
      this->genReg[i_2].type = argPtrLabel;
    }
    if ((this->genReg[i_2].type == argPtr) &&
       ((this->genReg[i_2].ptrBase == dreg || (this->genReg[i_2].ptrIndex == dreg)))) {
      this->genReg[i_2].type = argPtrLabel;
    }
  }
  for (entry._4_4_ = 0; entry._4_4_ < 0x10; entry._4_4_ = entry._4_4_ + 1) {
    if ((this->xmmReg[entry._4_4_].type == argPtr) &&
       ((this->xmmReg[entry._4_4_].ptrBase == dreg || (this->genReg[entry._4_4_].ptrIndex == dreg)))
       ) {
      this->xmmReg[entry._4_4_].type = argPtrLabel;
    }
  }
  entry._0_4_ = 0;
  do {
    if (0xf < (uint)entry) {
      return;
    }
    pMVar2 = this->memCache + (uint)entry;
    if (((pMVar2->address).type == argReg) && ((pMVar2->address).field_1.reg == dreg)) {
      (pMVar2->address).type = argNone;
      (pMVar2->value).type = argNone;
      if (0xf < this->memCacheFreeSlotCount) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0xdf,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
      }
      uVar1 = this->memCacheFreeSlotCount;
      this->memCacheFreeSlotCount = uVar1 + 1;
      this->memCacheFreeSlots[uVar1] = (uint)entry;
    }
    else if (((pMVar2->address).type == argPtr) &&
            (((pMVar2->address).ptrBase == dreg || ((pMVar2->address).ptrIndex == dreg)))) {
      (pMVar2->address).type = argNone;
      (pMVar2->value).type = argNone;
      if (0xf < this->memCacheFreeSlotCount) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0xe9,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
      }
      uVar1 = this->memCacheFreeSlotCount;
      this->memCacheFreeSlotCount = uVar1 + 1;
      this->memCacheFreeSlots[uVar1] = (uint)entry;
    }
    else if (((pMVar2->value).type == argReg) && ((pMVar2->value).field_1.reg == dreg)) {
      (pMVar2->value).type = argNone;
    }
    else if (((pMVar2->value).type == argPtr) &&
            (((pMVar2->value).ptrBase == dreg || ((pMVar2->value).ptrIndex == dreg)))) {
      (pMVar2->value).type = argNone;
    }
    entry._0_4_ = (uint)entry + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateDependand(x86Reg dreg)
{
	for(unsigned i = 0; i < rRegCount; i++)
	{
		if(genReg[i].type == x86Argument::argReg && genReg[i].reg == dreg)
			genReg[i].type = x86Argument::argPtrLabel;

		if(genReg[i].type == x86Argument::argPtr && (genReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			genReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		if(xmmReg[i].type == x86Argument::argPtr && (xmmReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			xmmReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argReg && entry.address.reg == dreg)
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.address.type == x86Argument::argPtr && (entry.address.ptrBase == dreg || entry.address.ptrIndex == dreg))
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.value.type == x86Argument::argReg && entry.value.reg == dreg)
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}

		if(entry.value.type == x86Argument::argPtr && (entry.value.ptrBase == dreg || entry.value.ptrIndex == dreg))
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}
	}
}